

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeVertexArrayApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::vertex_attrib_i_pointer(NegativeTestContext *ctx)

{
  NegativeTestContext *pNVar1;
  undefined1 local_e9;
  GLuint local_e8;
  GLbyte offset;
  GLuint vao;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  GLuint local_70;
  allocator<char> local_69;
  int maxVertexAttribs;
  allocator<char> local_31;
  string local_30;
  NegativeTestContext *local_10;
  NegativeTestContext *ctx_local;
  
  local_10 = ctx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"GL_INVALID_ENUM is generated if type is not an accepted value.",
             &local_31);
  NegativeTestContext::beginSection(ctx,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  glu::CallLogWrapper::glVertexAttribIPointer(&local_10->super_CallLogWrapper,0,1,0,0,(void *)0x0);
  NegativeTestContext::expectError(local_10,0x500);
  glu::CallLogWrapper::glVertexAttribIPointer
            (&local_10->super_CallLogWrapper,0,4,0x8d9f,0,(void *)0x0);
  NegativeTestContext::expectError(local_10,0x500);
  glu::CallLogWrapper::glVertexAttribIPointer
            (&local_10->super_CallLogWrapper,0,4,0x8368,0,(void *)0x0);
  NegativeTestContext::expectError(local_10,0x500);
  NegativeTestContext::endSection(local_10);
  pNVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&maxVertexAttribs,
             "GL_INVALID_VALUE is generated if index is greater than or equal to GL_MAX_VERTEX_ATTRIBS."
             ,&local_69);
  NegativeTestContext::beginSection(pNVar1,(string *)&maxVertexAttribs);
  std::__cxx11::string::~string((string *)&maxVertexAttribs);
  std::allocator<char>::~allocator(&local_69);
  local_70 = NegativeTestContext::getInteger(local_10,0x8869);
  glu::CallLogWrapper::glVertexAttribIPointer
            (&local_10->super_CallLogWrapper,local_70,1,0x1400,0,(void *)0x0);
  NegativeTestContext::expectError(local_10,0x501);
  NegativeTestContext::endSection(local_10);
  pNVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"GL_INVALID_VALUE is generated if size is not 1, 2, 3, or 4.",
             &local_91);
  NegativeTestContext::beginSection(pNVar1,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  glu::CallLogWrapper::glVertexAttribIPointer
            (&local_10->super_CallLogWrapper,0,0,0x1400,0,(void *)0x0);
  NegativeTestContext::expectError(local_10,0x501);
  NegativeTestContext::endSection(local_10);
  pNVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"GL_INVALID_VALUE is generated if stride is negative.",&local_b9);
  NegativeTestContext::beginSection(pNVar1,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  glu::CallLogWrapper::glVertexAttribIPointer
            (&local_10->super_CallLogWrapper,0,1,0x1400,-1,(void *)0x0);
  NegativeTestContext::expectError(local_10,0x501);
  NegativeTestContext::endSection(local_10);
  pNVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vao,
             "GL_INVALID_OPERATION is generated a non-zero vertex array object is bound, zero is bound to the GL_ARRAY_BUFFER buffer object binding point and the pointer argument is not NULL."
             ,(allocator<char> *)&offset);
  NegativeTestContext::beginSection(pNVar1,(string *)&vao);
  std::__cxx11::string::~string((string *)&vao);
  std::allocator<char>::~allocator((allocator<char> *)&offset);
  local_e8 = 0;
  local_e9 = 1;
  glu::CallLogWrapper::glGenVertexArrays(&local_10->super_CallLogWrapper,1,&local_e8);
  glu::CallLogWrapper::glBindVertexArray(&local_10->super_CallLogWrapper,local_e8);
  glu::CallLogWrapper::glBindBuffer(&local_10->super_CallLogWrapper,0x8892,0);
  NegativeTestContext::expectError(local_10,0);
  glu::CallLogWrapper::glVertexAttribIPointer
            (&local_10->super_CallLogWrapper,0,1,0x1400,0,&local_e9);
  NegativeTestContext::expectError(local_10,0x502);
  glu::CallLogWrapper::glBindVertexArray(&local_10->super_CallLogWrapper,0);
  glu::CallLogWrapper::glDeleteVertexArrays(&local_10->super_CallLogWrapper,1,&local_e8);
  NegativeTestContext::expectError(local_10,0);
  NegativeTestContext::endSection(local_10);
  return;
}

Assistant:

void vertex_attrib_i_pointer (NegativeTestContext& ctx)
{
	ctx.beginSection("GL_INVALID_ENUM is generated if type is not an accepted value.");
	ctx.glVertexAttribIPointer(0, 1, 0, 0, 0);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glVertexAttribIPointer(0, 4, GL_INT_2_10_10_10_REV, 0, 0);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glVertexAttribIPointer(0, 4, GL_UNSIGNED_INT_2_10_10_10_REV, 0, 0);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if index is greater than or equal to GL_MAX_VERTEX_ATTRIBS.");
	int maxVertexAttribs = ctx.getInteger(GL_MAX_VERTEX_ATTRIBS);
	ctx.glVertexAttribIPointer(maxVertexAttribs, 1, GL_BYTE, 0, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if size is not 1, 2, 3, or 4.");
	ctx.glVertexAttribIPointer(0, 0, GL_BYTE, 0, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if stride is negative.");
	ctx.glVertexAttribIPointer(0, 1, GL_BYTE, -1, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated a non-zero vertex array object is bound, zero is bound to the GL_ARRAY_BUFFER buffer object binding point and the pointer argument is not NULL.");
	GLuint vao = 0;
	GLbyte offset = 1;
	ctx.glGenVertexArrays(1, &vao);
	ctx.glBindVertexArray(vao);
	ctx.glBindBuffer(GL_ARRAY_BUFFER, 0);
	ctx.expectError(GL_NO_ERROR);

	ctx.glVertexAttribIPointer(0, 1, GL_BYTE, 0, &offset);
	ctx.expectError(GL_INVALID_OPERATION);

	ctx.glBindVertexArray(0);
	ctx.glDeleteVertexArrays(1, &vao);
	ctx.expectError(GL_NO_ERROR);
	ctx.endSection();
}